

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MAW.cpp
# Opt level: O0

RealType __thiscall
OpenMD::MAW::getSuggestedCutoffRadius(MAW *this,pair<OpenMD::AtomType_*,_OpenMD::AtomType_*> atypes)

{
  reference pvVar1;
  reference this_00;
  reference __src;
  AtomType *in_RDX;
  AtomType *in_RSI;
  long in_RDI;
  RealType beta;
  RealType R_e;
  MAWInteractionData mixer;
  int mtid2;
  int mtid1;
  int atid2;
  int atid1;
  MAW *in_stack_000001f0;
  undefined1 local_60 [8];
  double local_58;
  double local_50;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  AtomType *local_18;
  AtomType *local_10;
  double local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDX;
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    initialize(in_stack_000001f0);
  }
  local_24 = AtomType::getIdent(local_18);
  local_28 = AtomType::getIdent(local_10);
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_24);
  local_2c = *pvVar1;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_28);
  local_30 = *pvVar1;
  if ((local_2c == -1) || (local_30 == -1)) {
    local_8 = 0.0;
  }
  else {
    this_00 = std::
              vector<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
              ::operator[]((vector<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
                            *)(in_RDI + 0x58),(long)local_2c);
    __src = std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>::
            operator[](this_00,(long)local_30);
    memcpy(local_60,__src,0x30);
    local_8 = (local_50 * local_58 + 4.9) / local_50;
  }
  return local_8;
}

Assistant:

RealType MAW::getSuggestedCutoffRadius(pair<AtomType*, AtomType*> atypes) {
    if (!initialized_) initialize();
    int atid1 = atypes.first->getIdent();
    int atid2 = atypes.second->getIdent();
    int mtid1 = MAWtids[atid1];
    int mtid2 = MAWtids[atid2];

    if (mtid1 == -1 || mtid2 == -1)
      return 0.0;
    else {
      MAWInteractionData mixer = MixingMap[mtid1][mtid2];
      RealType R_e             = mixer.Re;
      RealType beta            = mixer.beta;
      // This value of the r corresponds to an energy about 1.48% of
      // the energy at the bottom of the Morse well.  For comparison, the
      // Lennard-Jones function is about 1.63% of it's minimum value at
      // a distance of 2.5 sigma.
      return (4.9 + beta * R_e) / beta;
    }
  }